

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O3

void png_set_quantize(png_structrp png_ptr,png_colorp palette,int num_palette,int maximum_colors,
                     png_const_uint_16p histogram,int full_quantize)

{
  png_bytep *pppVar1;
  byte bVar2;
  long *plVar3;
  undefined8 *puVar4;
  bool bVar5;
  png_byte pVar6;
  png_byte pVar7;
  png_byte pVar8;
  png_bytep ppVar9;
  undefined8 *puVar10;
  png_voidp pvVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  byte bVar19;
  long *ptr;
  long lVar20;
  uint uVar21;
  png_colorp ppVar22;
  png_colorp ppVar23;
  png_byte pVar24;
  byte *pbVar25;
  ulong uVar26;
  byte bVar27;
  uint uVar28;
  int iVar29;
  byte bVar30;
  int iVar31;
  ulong uVar32;
  uint uVar33;
  long lVar34;
  long lVar35;
  int iVar36;
  int iVar37;
  uint uVar38;
  png_byte *ppVar39;
  png_byte *ppVar40;
  png_color tmp_color;
  uint local_90;
  long local_68;
  
  if (png_ptr == (png_structrp)0x0) {
    return;
  }
  if ((png_ptr->flags & 0x40) != 0) {
    png_app_error(png_ptr,"invalid after png_start_read_image or png_read_update_info");
    return;
  }
  uVar16 = (ulong)(uint)num_palette;
  png_ptr->flags = png_ptr->flags | 0x4000;
  *(byte *)&png_ptr->transformations = (byte)png_ptr->transformations | 0x40;
  if (full_quantize == 0) {
    ppVar9 = (png_bytep)png_malloc(png_ptr,(long)num_palette);
    png_ptr->quantize_index = ppVar9;
    if (0 < num_palette) {
      uVar15 = 0;
      do {
        png_ptr->quantize_index[uVar15] = (png_byte)uVar15;
        uVar15 = uVar15 + 1;
      } while ((uint)num_palette != uVar15);
    }
  }
  if (maximum_colors < num_palette) {
    ppVar9 = (png_bytep)png_malloc(png_ptr,(long)num_palette);
    if (histogram == (png_const_uint_16p)0x0) {
      png_ptr->index_to_palette = ppVar9;
      ppVar9 = (png_bytep)png_malloc(png_ptr,(long)num_palette);
      png_ptr->palette_to_index = ppVar9;
      if (0 < num_palette) {
        uVar15 = 0;
        do {
          png_ptr->index_to_palette[uVar15] = (png_byte)uVar15;
          png_ptr->palette_to_index[uVar15] = (png_byte)uVar15;
          uVar15 = uVar15 + 1;
        } while ((uint)num_palette != uVar15);
      }
      pppVar1 = &png_ptr->index_to_palette;
      pvVar11 = png_calloc(png_ptr,0x1808);
      local_90 = 0x60;
      local_68 = 0x61;
      puVar10 = (undefined8 *)0x0;
LAB_00113c2d:
      iVar29 = 1;
      if (1 < (int)uVar16) {
        iVar29 = (int)uVar16;
      }
      uVar32 = 1;
      uVar15 = 0;
      ppVar40 = &palette[1].blue;
LAB_00113c5c:
      if (uVar15 != iVar29 - 1) goto code_r0x00113c65;
      if (puVar10 != (undefined8 *)0x0) {
        lVar35 = 0;
        do {
          for (puVar4 = *(undefined8 **)((long)pvVar11 + lVar35 * 8); puVar4 != (undefined8 *)0x0;
              puVar4 = (undefined8 *)*puVar4) {
            ppVar9 = *pppVar1;
            bVar30 = *(byte *)(puVar4 + 1);
            uVar12 = (uint)uVar16;
            if (((int)(uint)ppVar9[bVar30] < (int)uVar12) &&
               (bVar27 = *(byte *)((long)puVar4 + 9), ppVar9[bVar27] < uVar12)) {
              bVar19 = bVar30;
              if ((uVar16 & 1) == 0) {
                bVar19 = bVar27;
              }
              uVar12 = uVar12 - 1;
              uVar15 = (ulong)uVar12;
              bVar2 = ppVar9[bVar19];
              palette[bVar2].blue = palette[uVar15].blue;
              pVar24 = palette[uVar15].green;
              palette[bVar2].red = palette[uVar15].red;
              palette[bVar2].green = pVar24;
              if (0 < num_palette && full_quantize == 0) {
                if ((uVar16 & 1) == 0) {
                  bVar27 = bVar30;
                }
                uVar16 = 0;
                do {
                  ppVar9 = png_ptr->quantize_index;
                  bVar30 = ppVar9[uVar16];
                  if (bVar30 == png_ptr->index_to_palette[bVar19]) {
                    ppVar9[uVar16] = png_ptr->index_to_palette[bVar27];
                    ppVar9 = png_ptr->quantize_index;
                    bVar30 = ppVar9[uVar16];
                  }
                  if (uVar12 == bVar30) {
                    ppVar9[uVar16] = (*pppVar1)[bVar19];
                  }
                  uVar16 = uVar16 + 1;
                } while ((uint)num_palette != uVar16);
                ppVar9 = *pppVar1;
              }
              ppVar9[png_ptr->palette_to_index[uVar15]] = ppVar9[bVar19];
              png_ptr->palette_to_index[png_ptr->index_to_palette[bVar19]] =
                   png_ptr->palette_to_index[uVar15];
              png_ptr->index_to_palette[bVar19] = (png_byte)uVar12;
              png_ptr->palette_to_index[uVar15] = bVar19;
              uVar16 = uVar15;
            }
            if ((int)uVar16 <= maximum_colors) goto LAB_00113d55;
          }
          lVar35 = lVar35 + 1;
        } while (lVar35 != local_68);
        goto LAB_00113d55;
      }
      goto LAB_00113f28;
    }
    png_ptr->quantize_sort = ppVar9;
    if (0 < num_palette) {
      uVar15 = 0;
      do {
        png_ptr->quantize_sort[uVar15] = (png_byte)uVar15;
        uVar15 = uVar15 + 1;
      } while ((uint)num_palette != uVar15);
    }
    iVar29 = 1;
    if (1 < maximum_colors) {
      iVar29 = maximum_colors;
    }
    uVar12 = num_palette - 1;
    iVar17 = num_palette;
    do {
      if (iVar17 <= iVar29) break;
      iVar17 = iVar17 + -1;
      bVar5 = true;
      uVar15 = 0;
      do {
        ppVar9 = png_ptr->quantize_sort;
        bVar30 = ppVar9[uVar15];
        if (histogram[bVar30] < histogram[ppVar9[uVar15 + 1]]) {
          ppVar9[uVar15] = ppVar9[uVar15 + 1];
          png_ptr->quantize_sort[uVar15 + 1] = bVar30;
          bVar5 = false;
        }
        uVar15 = uVar15 + 1;
      } while (uVar12 != uVar15);
      uVar12 = uVar12 - 1;
    } while (!bVar5);
    if (full_quantize == 0) {
      if (0 < maximum_colors) {
        uVar16 = 0;
        iVar29 = num_palette;
        do {
          if (maximum_colors <= (int)(uint)png_ptr->quantize_sort[uVar16]) {
            lVar35 = (long)iVar29;
            ppVar22 = palette + iVar29;
            do {
              ppVar23 = ppVar22;
              lVar20 = lVar35 + -1;
              iVar29 = iVar29 + -1;
              ppVar22 = ppVar23 + -1;
              lVar34 = lVar35 + -1;
              lVar35 = lVar20;
            } while ((byte)maximum_colors <= png_ptr->quantize_sort[lVar34]);
            pVar24 = ppVar23[-1].blue;
            pVar7 = ppVar22->red;
            pVar8 = ppVar22->green;
            ppVar23[-1].blue = palette[uVar16].blue;
            pVar6 = palette[uVar16].green;
            ppVar22->red = palette[uVar16].red;
            ppVar22->green = pVar6;
            palette[uVar16].red = pVar7;
            palette[uVar16].green = pVar8;
            palette[uVar16].blue = pVar24;
            png_ptr->quantize_index[lVar20] = (png_byte)uVar16;
            png_ptr->quantize_index[uVar16] = (png_byte)iVar29;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != (uint)maximum_colors);
      }
      if (0 < num_palette) {
        uVar16 = 0;
        do {
          bVar30 = png_ptr->quantize_index[uVar16];
          if (maximum_colors <= (int)(uint)bVar30) {
            uVar15 = 0;
            pVar24 = '\0';
            if (1 < maximum_colors) {
              iVar17 = (uint)palette[bVar30].green - (uint)palette->green;
              iVar29 = -iVar17;
              if (0 < iVar17) {
                iVar29 = iVar17;
              }
              iVar36 = (uint)palette[bVar30].red - (uint)palette->red;
              iVar17 = -iVar36;
              if (0 < iVar36) {
                iVar17 = iVar36;
              }
              iVar37 = (uint)palette[bVar30].blue - (uint)palette->blue;
              iVar36 = -iVar37;
              if (0 < iVar37) {
                iVar36 = iVar37;
              }
              iVar36 = iVar36 + iVar17 + iVar29;
              uVar32 = 1;
              ppVar40 = &palette[1].blue;
              do {
                iVar17 = (uint)palette[bVar30].red - (uint)((png_color *)(ppVar40 + -2))->red;
                iVar29 = -iVar17;
                if (0 < iVar17) {
                  iVar29 = iVar17;
                }
                iVar37 = (uint)palette[bVar30].green - (uint)ppVar40[-1];
                iVar17 = -iVar37;
                if (0 < iVar37) {
                  iVar17 = iVar37;
                }
                iVar31 = (uint)palette[bVar30].blue - (uint)*ppVar40;
                iVar37 = -iVar31;
                if (0 < iVar31) {
                  iVar37 = iVar31;
                }
                iVar37 = iVar37 + iVar17 + iVar29;
                if (iVar37 < iVar36) {
                  uVar15 = uVar32 & 0xffffffff;
                  iVar36 = iVar37;
                }
                pVar24 = (png_byte)uVar15;
                uVar32 = uVar32 + 1;
                ppVar40 = ppVar40 + 3;
              } while ((uint)maximum_colors != uVar32);
            }
            png_ptr->quantize_index[uVar16] = pVar24;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != (uint)num_palette);
      }
    }
    else if (0 < maximum_colors) {
      ppVar9 = png_ptr->quantize_sort;
      uVar15 = 0;
      do {
        if (maximum_colors <= (int)(uint)ppVar9[uVar15]) {
          ppVar22 = palette + (int)uVar16;
          pbVar25 = ppVar9 + (long)(int)uVar16 + -1;
          do {
            ppVar23 = ppVar22;
            uVar16 = (ulong)((int)uVar16 - 1);
            ppVar22 = ppVar23 + -1;
            bVar30 = *pbVar25;
            pbVar25 = pbVar25 + -1;
          } while ((byte)maximum_colors <= bVar30);
          palette[uVar15].blue = ppVar23[-1].blue;
          pVar24 = ppVar22->green;
          palette[uVar15].red = ppVar22->red;
          palette[uVar15].green = pVar24;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != (uint)maximum_colors);
    }
    png_free(png_ptr,png_ptr->quantize_sort);
    png_ptr->quantize_sort = (png_bytep)0x0;
    num_palette = maximum_colors;
  }
LAB_00114143:
  if (png_ptr->palette == (png_colorp)0x0) {
    png_ptr->palette = palette;
  }
  png_ptr->num_palette = (png_uint_16)num_palette;
  if (full_quantize == 0) {
    return;
  }
  ppVar9 = (png_bytep)png_calloc(png_ptr,0x8000);
  png_ptr->palette_lookup = ppVar9;
  pvVar11 = png_malloc(png_ptr,0x8000);
  memset(pvVar11,0xff,0x8000);
  if (0 < num_palette) {
    uVar16 = 0;
    do {
      bVar30 = palette[uVar16].red >> 3;
      uVar12 = (uint)(palette[uVar16].green >> 3);
      uVar21 = (uint)(palette[uVar16].blue >> 3);
      lVar35 = 0;
      uVar15 = 0;
      do {
        uVar13 = (uint)bVar30 - (int)uVar15;
        if (bVar30 < uVar15) {
          uVar13 = (int)uVar15 - (uint)bVar30;
        }
        uVar32 = 0;
        lVar34 = lVar35;
        do {
          uVar14 = uVar12 - (int)uVar32;
          if (uVar12 < uVar32) {
            uVar14 = (int)uVar32 - uVar12;
          }
          uVar33 = uVar14;
          if ((int)uVar14 < (int)uVar13) {
            uVar33 = uVar13;
          }
          uVar26 = 0;
          uVar18 = uVar21;
          do {
            uVar28 = (int)uVar26 - uVar21;
            if (uVar26 <= uVar21) {
              uVar28 = uVar18;
            }
            uVar38 = uVar28;
            if ((int)uVar28 < (int)uVar33) {
              uVar38 = uVar33;
            }
            iVar29 = uVar28 + uVar13 + uVar14 + uVar38;
            if (iVar29 < (int)(uint)*(byte *)((long)pvVar11 + uVar26 + lVar34)) {
              *(char *)((long)pvVar11 + uVar26 + lVar34) = (char)iVar29;
              png_ptr->palette_lookup[uVar26 + lVar34] = (png_byte)uVar16;
            }
            uVar26 = uVar26 + 1;
            uVar18 = uVar18 - 1;
          } while (uVar26 != 0x20);
          uVar32 = uVar32 + 1;
          lVar34 = lVar34 + 0x20;
        } while (uVar32 != 0x20);
        uVar15 = uVar15 + 1;
        lVar35 = lVar35 + 0x400;
      } while (uVar15 != 0x20);
      uVar16 = uVar16 + 1;
    } while (uVar16 != (uint)num_palette);
  }
  png_free(png_ptr,pvVar11);
  return;
code_r0x00113c65:
  ppVar22 = palette + uVar15;
  uVar26 = uVar32;
  ppVar39 = ppVar40;
  do {
    uVar21 = (uint)ppVar22->red - (uint)((png_color *)(ppVar39 + -2))->red;
    uVar12 = -uVar21;
    if (0 < (int)uVar21) {
      uVar12 = uVar21;
    }
    uVar13 = (uint)ppVar22->green - (uint)ppVar39[-1];
    uVar21 = -uVar13;
    if (0 < (int)uVar13) {
      uVar21 = uVar13;
    }
    uVar14 = (uint)ppVar22->blue - (uint)*ppVar39;
    uVar13 = -uVar14;
    if (0 < (int)uVar14) {
      uVar13 = uVar14;
    }
    uVar12 = (uVar13 & 0xff) + (uVar21 & 0xff) + (uVar12 & 0xff);
    if (uVar12 <= local_90) {
      puVar10 = (undefined8 *)png_malloc_warn(png_ptr,0x10);
      if (puVar10 == (undefined8 *)0x0) {
        puVar10 = (undefined8 *)0x0;
        goto LAB_00113d55;
      }
      *puVar10 = *(undefined8 *)((long)pvVar11 + (ulong)uVar12 * 8);
      *(char *)(puVar10 + 1) = (char)uVar15;
      *(char *)((long)puVar10 + 9) = (char)uVar26;
      *(undefined8 **)((long)pvVar11 + (ulong)uVar12 * 8) = puVar10;
    }
    uVar26 = uVar26 + 1;
    ppVar39 = ppVar39 + 3;
  } while (uVar16 != uVar26);
  uVar32 = uVar32 + 1;
  ppVar40 = ppVar40 + 3;
  uVar15 = uVar15 + 1;
  if (puVar10 == (undefined8 *)0x0) goto LAB_00113f28;
  goto LAB_00113c5c;
LAB_00113f28:
  puVar10 = (undefined8 *)0x0;
LAB_00113d55:
  lVar35 = 0;
  do {
    ptr = *(long **)((long)pvVar11 + lVar35 * 8);
    if (ptr != (long *)0x0) {
      do {
        plVar3 = (long *)*ptr;
        png_free(png_ptr,ptr);
        ptr = plVar3;
      } while (plVar3 != (long *)0x0);
      puVar10 = (undefined8 *)0x0;
    }
    *(undefined8 *)((long)pvVar11 + lVar35 * 8) = 0;
    lVar35 = lVar35 + 1;
  } while (lVar35 != 0x301);
  local_90 = local_90 + 0x60;
  local_68 = local_68 + 0x60;
  if ((int)uVar16 <= maximum_colors) goto LAB_00113f33;
  goto LAB_00113c2d;
LAB_00113f33:
  png_free(png_ptr,pvVar11);
  png_free(png_ptr,png_ptr->palette_to_index);
  png_free(png_ptr,png_ptr->index_to_palette);
  *pppVar1 = (png_bytep)0x0;
  png_ptr->palette_to_index = (png_bytep)0x0;
  num_palette = maximum_colors;
  goto LAB_00114143;
}

Assistant:

void PNGAPI
png_set_quantize(png_structrp png_ptr, png_colorp palette,
    int num_palette, int maximum_colors, png_const_uint_16p histogram,
    int full_quantize)
{
   png_debug(1, "in png_set_quantize");

   if (png_rtran_ok(png_ptr, 0) == 0)
      return;

   png_ptr->transformations |= PNG_QUANTIZE;

   if (full_quantize == 0)
   {
      int i;

      png_ptr->quantize_index = (png_bytep)png_malloc(png_ptr,
          (png_alloc_size_t)num_palette);
      for (i = 0; i < num_palette; i++)
         png_ptr->quantize_index[i] = (png_byte)i;
   }

   if (num_palette > maximum_colors)
   {
      if (histogram != NULL)
      {
         /* This is easy enough, just throw out the least used colors.
          * Perhaps not the best solution, but good enough.
          */

         int i;

         /* Initialize an array to sort colors */
         png_ptr->quantize_sort = (png_bytep)png_malloc(png_ptr,
             (png_alloc_size_t)num_palette);

         /* Initialize the quantize_sort array */
         for (i = 0; i < num_palette; i++)
            png_ptr->quantize_sort[i] = (png_byte)i;

         /* Find the least used palette entries by starting a
          * bubble sort, and running it until we have sorted
          * out enough colors.  Note that we don't care about
          * sorting all the colors, just finding which are
          * least used.
          */

         for (i = num_palette - 1; i >= maximum_colors; i--)
         {
            int done; /* To stop early if the list is pre-sorted */
            int j;

            done = 1;
            for (j = 0; j < i; j++)
            {
               if (histogram[png_ptr->quantize_sort[j]]
                   < histogram[png_ptr->quantize_sort[j + 1]])
               {
                  png_byte t;

                  t = png_ptr->quantize_sort[j];
                  png_ptr->quantize_sort[j] = png_ptr->quantize_sort[j + 1];
                  png_ptr->quantize_sort[j + 1] = t;
                  done = 0;
               }
            }

            if (done != 0)
               break;
         }

         /* Swap the palette around, and set up a table, if necessary */
         if (full_quantize != 0)
         {
            int j = num_palette;

            /* Put all the useful colors within the max, but don't
             * move the others.
             */
            for (i = 0; i < maximum_colors; i++)
            {
               if ((int)png_ptr->quantize_sort[i] >= maximum_colors)
               {
                  do
                     j--;
                  while ((int)png_ptr->quantize_sort[j] >= maximum_colors);

                  palette[i] = palette[j];
               }
            }
         }
         else
         {
            int j = num_palette;

            /* Move all the used colors inside the max limit, and
             * develop a translation table.
             */
            for (i = 0; i < maximum_colors; i++)
            {
               /* Only move the colors we need to */
               if ((int)png_ptr->quantize_sort[i] >= maximum_colors)
               {
                  png_color tmp_color;

                  do
                     j--;
                  while ((int)png_ptr->quantize_sort[j] >= maximum_colors);

                  tmp_color = palette[j];
                  palette[j] = palette[i];
                  palette[i] = tmp_color;
                  /* Indicate where the color went */
                  png_ptr->quantize_index[j] = (png_byte)i;
                  png_ptr->quantize_index[i] = (png_byte)j;
               }
            }

            /* Find closest color for those colors we are not using */
            for (i = 0; i < num_palette; i++)
            {
               if ((int)png_ptr->quantize_index[i] >= maximum_colors)
               {
                  int min_d, k, min_k, d_index;

                  /* Find the closest color to one we threw out */
                  d_index = png_ptr->quantize_index[i];
                  min_d = PNG_COLOR_DIST(palette[d_index], palette[0]);
                  for (k = 1, min_k = 0; k < maximum_colors; k++)
                  {
                     int d;

                     d = PNG_COLOR_DIST(palette[d_index], palette[k]);

                     if (d < min_d)
                     {
                        min_d = d;
                        min_k = k;
                     }
                  }
                  /* Point to closest color */
                  png_ptr->quantize_index[i] = (png_byte)min_k;
               }
            }
         }
         png_free(png_ptr, png_ptr->quantize_sort);
         png_ptr->quantize_sort = NULL;
      }
      else
      {
         /* This is much harder to do simply (and quickly).  Perhaps
          * we need to go through a median cut routine, but those
          * don't always behave themselves with only a few colors
          * as input.  So we will just find the closest two colors,
          * and throw out one of them (chosen somewhat randomly).
          * [We don't understand this at all, so if someone wants to
          *  work on improving it, be our guest - AED, GRP]
          */
         int i;
         int max_d;
         int num_new_palette;
         png_dsortp t;
         png_dsortpp hash;

         t = NULL;

         /* Initialize palette index arrays */
         png_ptr->index_to_palette = (png_bytep)png_malloc(png_ptr,
             (png_alloc_size_t)num_palette);
         png_ptr->palette_to_index = (png_bytep)png_malloc(png_ptr,
             (png_alloc_size_t)num_palette);

         /* Initialize the sort array */
         for (i = 0; i < num_palette; i++)
         {
            png_ptr->index_to_palette[i] = (png_byte)i;
            png_ptr->palette_to_index[i] = (png_byte)i;
         }

         hash = (png_dsortpp)png_calloc(png_ptr, (png_alloc_size_t)(769 *
             (sizeof (png_dsortp))));

         num_new_palette = num_palette;

         /* Initial wild guess at how far apart the farthest pixel
          * pair we will be eliminating will be.  Larger
          * numbers mean more areas will be allocated, Smaller
          * numbers run the risk of not saving enough data, and
          * having to do this all over again.
          *
          * I have not done extensive checking on this number.
          */
         max_d = 96;

         while (num_new_palette > maximum_colors)
         {
            for (i = 0; i < num_new_palette - 1; i++)
            {
               int j;

               for (j = i + 1; j < num_new_palette; j++)
               {
                  int d;

                  d = PNG_COLOR_DIST(palette[i], palette[j]);

                  if (d <= max_d)
                  {

                     t = (png_dsortp)png_malloc_warn(png_ptr,
                         (png_alloc_size_t)(sizeof (png_dsort)));

                     if (t == NULL)
                         break;

                     t->next = hash[d];
                     t->left = (png_byte)i;
                     t->right = (png_byte)j;
                     hash[d] = t;
                  }
               }
               if (t == NULL)
                  break;
            }

            if (t != NULL)
            for (i = 0; i <= max_d; i++)
            {
               if (hash[i] != NULL)
               {
                  png_dsortp p;

                  for (p = hash[i]; p; p = p->next)
                  {
                     if ((int)png_ptr->index_to_palette[p->left]
                         < num_new_palette &&
                         (int)png_ptr->index_to_palette[p->right]
                         < num_new_palette)
                     {
                        int j, next_j;

                        if (num_new_palette & 0x01)
                        {
                           j = p->left;
                           next_j = p->right;
                        }
                        else
                        {
                           j = p->right;
                           next_j = p->left;
                        }

                        num_new_palette--;
                        palette[png_ptr->index_to_palette[j]]
                            = palette[num_new_palette];
                        if (full_quantize == 0)
                        {
                           int k;

                           for (k = 0; k < num_palette; k++)
                           {
                              if (png_ptr->quantize_index[k] ==
                                  png_ptr->index_to_palette[j])
                                 png_ptr->quantize_index[k] =
                                     png_ptr->index_to_palette[next_j];

                              if ((int)png_ptr->quantize_index[k] ==
                                  num_new_palette)
                                 png_ptr->quantize_index[k] =
                                     png_ptr->index_to_palette[j];
                           }
                        }

                        png_ptr->index_to_palette[png_ptr->palette_to_index
                            [num_new_palette]] = png_ptr->index_to_palette[j];

                        png_ptr->palette_to_index[png_ptr->index_to_palette[j]]
                            = png_ptr->palette_to_index[num_new_palette];

                        png_ptr->index_to_palette[j] =
                            (png_byte)num_new_palette;

                        png_ptr->palette_to_index[num_new_palette] =
                            (png_byte)j;
                     }
                     if (num_new_palette <= maximum_colors)
                        break;
                  }
                  if (num_new_palette <= maximum_colors)
                     break;
               }
            }

            for (i = 0; i < 769; i++)
            {
               if (hash[i] != NULL)
               {
                  png_dsortp p = hash[i];
                  while (p)
                  {
                     t = p->next;
                     png_free(png_ptr, p);
                     p = t;
                  }
               }
               hash[i] = 0;
            }
            max_d += 96;
         }
         png_free(png_ptr, hash);
         png_free(png_ptr, png_ptr->palette_to_index);
         png_free(png_ptr, png_ptr->index_to_palette);
         png_ptr->palette_to_index = NULL;
         png_ptr->index_to_palette = NULL;
      }
      num_palette = maximum_colors;
   }
   if (png_ptr->palette == NULL)
   {
      png_ptr->palette = palette;
   }
   png_ptr->num_palette = (png_uint_16)num_palette;

   if (full_quantize != 0)
   {
      int i;
      png_bytep distance;
      int total_bits = PNG_QUANTIZE_RED_BITS + PNG_QUANTIZE_GREEN_BITS +
          PNG_QUANTIZE_BLUE_BITS;
      int num_red = (1 << PNG_QUANTIZE_RED_BITS);
      int num_green = (1 << PNG_QUANTIZE_GREEN_BITS);
      int num_blue = (1 << PNG_QUANTIZE_BLUE_BITS);
      size_t num_entries = ((size_t)1 << total_bits);

      png_ptr->palette_lookup = (png_bytep)png_calloc(png_ptr,
          (png_alloc_size_t)(num_entries));

      distance = (png_bytep)png_malloc(png_ptr, (png_alloc_size_t)num_entries);

      memset(distance, 0xff, num_entries);

      for (i = 0; i < num_palette; i++)
      {
         int ir, ig, ib;
         int r = (palette[i].red >> (8 - PNG_QUANTIZE_RED_BITS));
         int g = (palette[i].green >> (8 - PNG_QUANTIZE_GREEN_BITS));
         int b = (palette[i].blue >> (8 - PNG_QUANTIZE_BLUE_BITS));

         for (ir = 0; ir < num_red; ir++)
         {
            /* int dr = abs(ir - r); */
            int dr = ((ir > r) ? ir - r : r - ir);
            int index_r = (ir << (PNG_QUANTIZE_BLUE_BITS +
                PNG_QUANTIZE_GREEN_BITS));

            for (ig = 0; ig < num_green; ig++)
            {
               /* int dg = abs(ig - g); */
               int dg = ((ig > g) ? ig - g : g - ig);
               int dt = dr + dg;
               int dm = ((dr > dg) ? dr : dg);
               int index_g = index_r | (ig << PNG_QUANTIZE_BLUE_BITS);

               for (ib = 0; ib < num_blue; ib++)
               {
                  int d_index = index_g | ib;
                  /* int db = abs(ib - b); */
                  int db = ((ib > b) ? ib - b : b - ib);
                  int dmax = ((dm > db) ? dm : db);
                  int d = dmax + dt + db;

                  if (d < (int)distance[d_index])
                  {
                     distance[d_index] = (png_byte)d;
                     png_ptr->palette_lookup[d_index] = (png_byte)i;
                  }
               }
            }
         }
      }

      png_free(png_ptr, distance);
   }
}